

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::JsonOutput::startWitness(JsonOutput *this,double time)

{
  bool bVar1;
  char *in_RDI;
  double in_XMM0_Qa;
  JsonOutput *unaff_retaddr;
  
  bVar1 = hasWitnesses(unaff_retaddr);
  if (!bVar1) {
    pushObject(unaff_retaddr,in_RDI,(ObjType)((ulong)in_XMM0_Qa >> 0x20),
               SUB81((ulong)in_XMM0_Qa >> 0x18,0));
  }
  pushObject(unaff_retaddr,in_RDI,(ObjType)((ulong)in_XMM0_Qa >> 0x20),
             SUB81((ulong)in_XMM0_Qa >> 0x18,0));
  printTime(unaff_retaddr,in_RDI,in_XMM0_Qa);
  return;
}

Assistant:

void JsonOutput::startWitness(double time) {
	if (!hasWitnesses()) {
		pushObject("Witnesses", type_array);
	}
	pushObject();
	printTime("Time", time);
}